

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

string * __thiscall
EdgeEnv::MakePathList_abi_cxx11_
          (string *__return_storage_ptr__,EdgeEnv *this,Node **span,size_t size,char sep)

{
  long lVar1;
  string result;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  for (lVar1 = 0; size << 3 != lVar1; lVar1 = lVar1 + 8) {
    if (__return_storage_ptr__->_M_string_length != 0) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    std::__cxx11::string::string((string *)&local_50,*(string **)((long)span + lVar1));
    if (this->escape_in_out_ == kShellEscape) {
      GetShellEscapedString(&local_50,__return_storage_ptr__);
    }
    else {
      std::__cxx11::string::append((string *)__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EdgeEnv::MakePathList(const Node* const* const span,
                                  const size_t size, const char sep) const {
  string result;
  for (const Node* const* i = span; i != span + size; ++i) {
    if (!result.empty())
      result.push_back(sep);
    const string& path = (*i)->PathDecanonicalized();
    if (escape_in_out_ == kShellEscape) {
#ifdef _WIN32
      GetWin32EscapedString(path, &result);
#else
      GetShellEscapedString(path, &result);
#endif
    } else {
      result.append(path);
    }
  }
  return result;
}